

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_aggregate.cpp
# Opt level: O1

string * __thiscall
duckdb::LogicalAggregate::GetName_abi_cxx11_(string *__return_storage_ptr__,LogicalAggregate *this)

{
  LogicalOperator::GetName_abi_cxx11_(__return_storage_ptr__,&this->super_LogicalOperator);
  return __return_storage_ptr__;
}

Assistant:

string LogicalAggregate::GetName() const {
#ifdef DEBUG
	if (DBConfigOptions::debug_print_bindings) {
		return LogicalOperator::GetName() +
		       StringUtil::Format(" #%llu, #%llu, #%llu", group_index, aggregate_index, groupings_index);
	}
#endif
	return LogicalOperator::GetName();
}